

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

void sq_newtable(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQSharedState *ss;
  SQObjectValue this;
  SQObjectPtr local_28;
  
  ss = v->_sharedstate;
  this.pUserPointer = sq_vm_malloc(ss->_alloc_ctx,0x60);
  SQTable::SQTable(this.pTable,ss,0);
  ((this.pTable)->super_SQDelegable)._delegate = (SQTable *)0x0;
  local_28.super_SQObject._type = OT_TABLE;
  local_28.super_SQObject._flags = '\0';
  pSVar1 = &((this.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_28.super_SQObject._unVal.pUserPointer = this.pUserPointer;
  SQVM::Push(v,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  return;
}

Assistant:

void sq_newtable(HSQUIRRELVM v)
{
    v->ValidateThreadAccess();
    v->Push(SQTable::Create(_ss(v), 0));
}